

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_capability_resp(connectdata *conn,int imapcode,imapstate instate)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  size_t sStack_48;
  uint mechbit;
  size_t llen;
  size_t wordlen;
  char *line;
  imap_conn *imapc;
  Curl_easy *data;
  imapstate local_18;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  imapc = (imap_conn *)conn->data;
  line = (char *)&conn->proto;
  wordlen = (size_t)(((Curl_easy *)imapc)->state).buffer;
  local_18 = instate;
  _instate_local = conn;
  if (imapcode == 0x2a) {
    wordlen = wordlen + 2;
    result = CURLE_ABORTED_BY_CALLBACK;
    while( true ) {
      while( true ) {
        bVar3 = false;
        if ((((*(char *)wordlen != '\0') && (bVar3 = true, *(char *)wordlen != ' ')) &&
            (bVar3 = true, *(char *)wordlen != '\t')) && (bVar3 = true, *(char *)wordlen != '\r')) {
          bVar3 = *(char *)wordlen == '\n';
        }
        if (!bVar3) break;
        wordlen = wordlen + 1;
      }
      if (*(char *)wordlen == '\0') break;
      llen = 0;
      while( true ) {
        bVar3 = false;
        if (((*(char *)(wordlen + llen) != '\0') &&
            (bVar3 = false, *(char *)(wordlen + llen) != ' ')) &&
           ((bVar3 = false, *(char *)(wordlen + llen) != '\t' &&
            (bVar3 = false, *(char *)(wordlen + llen) != '\r')))) {
          bVar3 = *(char *)(wordlen + llen) != '\n';
        }
        if (!bVar3) break;
        llen = llen + 1;
      }
      if ((llen == 8) && (*(long *)wordlen == 0x534c545452415453)) {
        line[0xa5] = '\x01';
      }
      else if ((llen == 0xd) && (iVar1 = memcmp((void *)wordlen,"LOGINDISABLED",0xd), iVar1 == 0)) {
        line[0xa6] = '\x01';
      }
      else if ((llen == 7) && (iVar1 = memcmp((void *)wordlen,"SASL-IR",7), iVar1 == 0)) {
        line[0xa7] = '\x01';
      }
      else if ((5 < llen) && (iVar1 = memcmp((void *)wordlen,"AUTH=",5), iVar1 == 0)) {
        wordlen = wordlen + 5;
        llen = llen - 5;
        uVar2 = Curl_sasl_decode_mech((char *)wordlen,llen,&stack0xffffffffffffffb8);
        if ((uVar2 != 0) && (sStack_48 == llen)) {
          *(uint *)(line + 0x84) = uVar2 | *(uint *)(line + 0x84);
        }
      }
      wordlen = llen + wordlen;
    }
  }
  else {
    result = imapcode;
    if (imapcode == 1) {
      if (((((Curl_easy *)imapc)->set).use_ssl == CURLUSESSL_NONE) || ((conn->ssl[0].use & 1U) != 0)
         ) {
        data._4_4_ = imap_perform_authentication(conn);
      }
      else if (((conn->proto).imapc.tls_supported & 1U) == 0) {
        if ((((Curl_easy *)imapc)->set).use_ssl == CURLUSESSL_TRY) {
          data._4_4_ = imap_perform_authentication(conn);
        }
        else {
          Curl_failf((Curl_easy *)imapc,"STARTTLS not supported.");
          data._4_4_ = CURLE_USE_SSL_FAILED;
        }
      }
      else {
        data._4_4_ = imap_perform_starttls(conn);
      }
    }
    else {
      data._4_4_ = imap_perform_authentication(conn);
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_capability_resp(struct connectdata *conn,
                                           int imapcode,
                                           imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *line = data->state.buffer;

  (void)instate; /* no use for this yet */

  /* Do we have a untagged response? */
  if(imapcode == '*') {
    line += 2;

    /* Loop through the data line */
    for(;;) {
      size_t wordlen;
      while(*line &&
            (*line == ' ' || *line == '\t' ||
              *line == '\r' || *line == '\n')) {

        line++;
      }

      if(!*line)
        break;

      /* Extract the word */
      for(wordlen = 0; line[wordlen] && line[wordlen] != ' ' &&
            line[wordlen] != '\t' && line[wordlen] != '\r' &&
            line[wordlen] != '\n';)
        wordlen++;

      /* Does the server support the STARTTLS capability? */
      if(wordlen == 8 && !memcmp(line, "STARTTLS", 8))
        imapc->tls_supported = TRUE;

      /* Has the server explicitly disabled clear text authentication? */
      else if(wordlen == 13 && !memcmp(line, "LOGINDISABLED", 13))
        imapc->login_disabled = TRUE;

      /* Does the server support the SASL-IR capability? */
      else if(wordlen == 7 && !memcmp(line, "SASL-IR", 7))
        imapc->ir_supported = TRUE;

      /* Do we have a SASL based authentication mechanism? */
      else if(wordlen > 5 && !memcmp(line, "AUTH=", 5)) {
        size_t llen;
        unsigned int mechbit;

        line += 5;
        wordlen -= 5;

        /* Test the word for a matching authentication mechanism */
        mechbit = Curl_sasl_decode_mech(line, wordlen, &llen);
        if(mechbit && llen == wordlen)
          imapc->sasl.authmechs |= mechbit;
      }

      line += wordlen;
    }
  }
  else if(imapcode == IMAP_RESP_OK) {
    if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
      /* We don't have a SSL/TLS connection yet, but SSL is requested */
      if(imapc->tls_supported)
        /* Switch to TLS connection now */
        result = imap_perform_starttls(conn);
      else if(data->set.use_ssl == CURLUSESSL_TRY)
        /* Fallback and carry on with authentication */
        result = imap_perform_authentication(conn);
      else {
        failf(data, "STARTTLS not supported.");
        result = CURLE_USE_SSL_FAILED;
      }
    }
    else
      result = imap_perform_authentication(conn);
  }
  else
    result = imap_perform_authentication(conn);

  return result;
}